

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::LoadBlockIndex(BlockManager *this,optional<uint256> *snapshot_blockhash)

{
  CChainParams *pCVar1;
  pointer pAVar2;
  Notifications *pNVar3;
  long *plVar4;
  ushort uVar5;
  uint uVar6;
  string_view source_file;
  string_view source_file_00;
  function<CBlockIndex_*(const_uint256_&)> insertBlockIndex;
  undefined8 uVar7;
  pointer ppCVar8;
  bool bVar9;
  char cVar10;
  int i;
  int iVar11;
  optional<AssumeutxoData> *poVar12;
  CBlockIndex *pCVar13;
  Logger *pLVar14;
  ulong uVar15;
  char cVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar17;
  pointer pAVar18;
  char *pcVar19;
  pointer ppCVar20;
  long in_FS_OFFSET;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  CBlockIndex *pindex;
  string log_msg;
  optional<AssumeutxoData> maybe_au_data;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> vSortedByHeight;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  CBlockIndex *local_1d8;
  int local_1c4;
  undefined1 local_1c0 [16];
  code *local_1b0;
  code *local_1a8;
  undefined1 local_198 [32];
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [16];
  undefined1 auStack_e8 [80];
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> local_98 [2];
  string local_58;
  _Alloc_hider local_38;
  
  bVar21 = 0;
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  local_1c0._8_8_ = 0;
  local_1a8 = std::
              _Function_handler<CBlockIndex_*(const_uint256_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp:400:29)>
              ::_M_invoke;
  local_1b0 = std::
              _Function_handler<CBlockIndex_*(const_uint256_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp:400:29)>
              ::_M_manager;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->m_interrupt;
  insertBlockIndex.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffdf0;
  insertBlockIndex.super__Function_base._M_functor._M_unused._M_object =
       (void *)in_stack_fffffffffffffde8;
  insertBlockIndex.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffdf8;
  insertBlockIndex._M_invoker._0_4_ = in_stack_fffffffffffffe00;
  insertBlockIndex._M_invoker._4_4_ = in_stack_fffffffffffffe04;
  local_1c0._0_8_ = this;
  bVar9 = kernel::BlockTreeDB::LoadBlockIndexGuts
                    ((this->m_block_tree_db)._M_t.
                     super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                     .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,
                     &((this->m_opts).chainparams)->consensus,insertBlockIndex,
                     (SignalInterrupt *)local_1c0);
  if (local_1b0 != (code *)0x0) {
    (*local_1b0)(local_1c0,local_1c0,3);
  }
  if (bVar9) {
    cVar10 = (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
             super__Optional_payload_base<uint256>._M_engaged;
    if ((bool)cVar10 != true) {
      cVar16 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_engaged;
      if ((bool)cVar16 == true) {
        (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged = false;
        cVar16 = '\0';
      }
LAB_0091a1df:
      local_f8[0] = cVar16 == cVar10;
      pcVar19 = "m_snapshot_height.has_value() == snapshot_blockhash.has_value()";
      inline_assertion_check<true,bool>
                ((bool *)local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                 ,0x1aa,"LoadBlockIndex",
                 "m_snapshot_height.has_value() == snapshot_blockhash.has_value()");
      GetAllBlockIndices(local_98,this);
      ppCVar8 = local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppCVar20 = local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      bVar9 = true;
      if (local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar15 = (long)local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        lVar17 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<CBlockIndex**,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<node::CBlockIndexHeightOnlyComparator>>
                  (local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<CBlockIndex**,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,__gnu_cxx::__ops::_Iter_comp_iter<node::CBlockIndexHeightOnlyComparator>>
                  (ppCVar20,ppCVar8);
        if (local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          ppCVar20 = local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pCVar13 = (CBlockIndex *)0x0;
          do {
            local_198._0_8_ = *ppCVar20;
            bVar9 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
            uVar7 = local_198._0_8_;
            if (bVar9) {
LAB_0091a657:
              bVar9 = false;
              goto LAB_0091a661;
            }
            if ((pCVar13 != (CBlockIndex *)0x0) &&
               (iVar11 = pCVar13->nHeight + 1, iVar11 < *(int *)(local_198._0_8_ + 0x18))) {
              local_1c4 = iVar11;
              pLVar14 = LogInstance();
              bVar9 = BCLog::Logger::Enabled(pLVar14);
              if (bVar9) {
                local_f8._8_8_ = (CBlockIndex *)0x0;
                auStack_e8._0_8_ = auStack_e8._0_8_ & 0xffffffffffffff00;
                local_f8._0_8_ = (CBlockIndex *)auStack_e8;
                tinyformat::format<char[15],int>
                          ((string *)local_138,
                           (tinyformat *)
                           "%s: block index is non-contiguous, index of height %d missing\n",
                           "LoadBlockIndex",(char (*) [15])&local_1c4,(int *)pcVar19);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_138);
                if ((CBlockIndex *)local_138._0_8_ != (CBlockIndex *)(local_138 + 0x10)) {
                  operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
                }
                pLVar14 = LogInstance();
                local_138._0_8_ = (CBlockIndex *)0x5e;
                local_138._8_8_ =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                ;
                source_file_00._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                ;
                source_file_00._M_len = 0x5e;
                str_00._M_str = (char *)local_f8._0_8_;
                str_00._M_len = local_f8._8_8_;
                logging_function_00._M_str = "LoadBlockIndex";
                logging_function_00._M_len = 0xe;
                BCLog::Logger::LogPrintStr
                          (pLVar14,str_00,logging_function_00,source_file_00,0x1b5,ALL,Error);
                if ((CBlockIndex *)local_f8._0_8_ != (CBlockIndex *)auStack_e8) {
                  operator_delete((void *)local_f8._0_8_,auStack_e8._0_8_ + 1);
                }
              }
              goto LAB_0091a657;
            }
            pCVar13 = *(CBlockIndex **)(local_198._0_8_ + 8);
            if (pCVar13 == (CBlockIndex *)0x0) {
              local_58._M_dataplus._M_p = (pointer)0x0;
              local_58._M_string_length = 0;
              local_58.field_2._M_allocated_capacity = 0;
              local_1d8 = (CBlockIndex *)0x0;
            }
            else {
              local_1d8 = *(CBlockIndex **)(pCVar13->nChainWork).super_base_uint<256U>.pn;
              local_58.field_2._M_allocated_capacity =
                   *(undefined8 *)((pCVar13->nChainWork).super_base_uint<256U>.pn + 6);
              local_58._0_16_ =
                   *(undefined1 (*) [16])((pCVar13->nChainWork).super_base_uint<256U>.pn + 2);
            }
            GetBlockProof((arith_uint256 *)&local_178,(CBlockIndex *)local_198._0_8_);
            local_f8._0_8_ = local_1d8;
            auStack_e8._8_8_ = local_58.field_2._M_allocated_capacity;
            local_f8._8_8_ = local_58._M_dataplus._M_p;
            auStack_e8._0_8_ = local_58._M_string_length;
            lVar17 = 0;
            uVar15 = 0;
            do {
              uVar15 = (ulong)*(uint *)((long)&local_178._M_dataplus._M_p + lVar17 * 4) +
                       *(uint *)(local_f8 + lVar17 * 4) + uVar15;
              *(int *)(local_f8 + lVar17 * 4) = (int)uVar15;
              uVar15 = uVar15 >> 0x20;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 8);
            local_138._16_8_ = auStack_e8._0_8_;
            local_138._24_8_ = auStack_e8._8_8_;
            local_138._0_8_ = local_f8._0_8_;
            local_138._8_8_ = local_f8._8_8_;
            *(undefined8 *)(local_198._0_8_ + 0x38) = auStack_e8._0_8_;
            *(undefined8 *)(local_198._0_8_ + 0x40) = auStack_e8._8_8_;
            *(undefined8 *)(((arith_uint256 *)(local_198._0_8_ + 0x28))->super_base_uint<256U>).pn =
                 local_f8._0_8_;
            *(undefined8 *)(local_198._0_8_ + 0x30) = local_f8._8_8_;
            pCVar13 = *(CBlockIndex **)(local_198._0_8_ + 8);
            if (pCVar13 == (CBlockIndex *)0x0) {
              *(uint32_t *)(local_198._0_8_ + 0x90) = *(uint32_t *)(local_198._0_8_ + 0x80);
              if ((ulong)*(uint *)(local_198._0_8_ + 0x48) != 0) {
                *(ulong *)(local_198._0_8_ + 0x50) = (ulong)*(uint *)(local_198._0_8_ + 0x48);
              }
            }
            else {
              uVar6 = *(uint32_t *)(local_198._0_8_ + 0x80);
              if (*(uint32_t *)(local_198._0_8_ + 0x80) < pCVar13->nTimeMax) {
                uVar6 = pCVar13->nTimeMax;
              }
              *(uint *)(local_198._0_8_ + 0x90) = uVar6;
              if ((ulong)*(uint *)(local_198._0_8_ + 0x48) != 0) {
                if (((this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>._M_engaged == true) &&
                   (*(int *)(local_198._0_8_ + 0x18) ==
                    (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>._M_payload._M_value)) {
                  plVar4 = *(long **)local_198._0_8_;
                  if (plVar4 == (long *)0x0) {
                    __assert_fail("phashBlock != nullptr",
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
                  }
                  local_f8._0_8_ = *plVar4;
                  local_f8._8_8_ = plVar4[1];
                  auStack_e8._0_8_ = plVar4[2];
                  auStack_e8._8_8_ = plVar4[3];
                  auVar25[0] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x10] ==
                                (uchar)plVar4[2]);
                  auVar25[1] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x11] ==
                                *(uchar *)((long)plVar4 + 0x11));
                  auVar25[2] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x12] ==
                                *(uchar *)((long)plVar4 + 0x12));
                  auVar25[3] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x13] ==
                                *(uchar *)((long)plVar4 + 0x13));
                  auVar25[4] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x14] ==
                                *(uchar *)((long)plVar4 + 0x14));
                  auVar25[5] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x15] ==
                                *(uchar *)((long)plVar4 + 0x15));
                  auVar25[6] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x16] ==
                                *(uchar *)((long)plVar4 + 0x16));
                  auVar25[7] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x17] ==
                                *(uchar *)((long)plVar4 + 0x17));
                  auVar25[8] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x18] ==
                                (uchar)plVar4[3]);
                  auVar25[9] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x19] ==
                                *(uchar *)((long)plVar4 + 0x19));
                  auVar25[10] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                  _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                  _M_value.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                                 *(uchar *)((long)plVar4 + 0x1a));
                  auVar25[0xb] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                                  *(uchar *)((long)plVar4 + 0x1b));
                  auVar25[0xc] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                                  *(uchar *)((long)plVar4 + 0x1c));
                  auVar25[0xd] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                                  *(uchar *)((long)plVar4 + 0x1d));
                  auVar25[0xe] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                                  *(uchar *)((long)plVar4 + 0x1e));
                  auVar25[0xf] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                                  *(uchar *)((long)plVar4 + 0x1f));
                  auVar23[0] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0] == (char)*plVar4)
                  ;
                  auVar23[1] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[1] ==
                                *(uchar *)((long)plVar4 + 1));
                  auVar23[2] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[2] ==
                                *(uchar *)((long)plVar4 + 2));
                  auVar23[3] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[3] ==
                                *(uchar *)((long)plVar4 + 3));
                  auVar23[4] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[4] ==
                                *(uchar *)((long)plVar4 + 4));
                  auVar23[5] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[5] ==
                                *(uchar *)((long)plVar4 + 5));
                  auVar23[6] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[6] ==
                                *(uchar *)((long)plVar4 + 6));
                  auVar23[7] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[7] ==
                                *(uchar *)((long)plVar4 + 7));
                  auVar23[8] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[8] ==
                                (uchar)plVar4[1]);
                  auVar23[9] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[9] ==
                                *(uchar *)((long)plVar4 + 9));
                  auVar23[10] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                  _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                  _M_value.super_base_blob<256U>.m_data._M_elems[10] ==
                                 *(uchar *)((long)plVar4 + 10));
                  auVar23[0xb] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0xb] ==
                                  *(uchar *)((long)plVar4 + 0xb));
                  auVar23[0xc] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0xc] ==
                                  *(uchar *)((long)plVar4 + 0xc));
                  auVar23[0xd] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0xd] ==
                                  *(uchar *)((long)plVar4 + 0xd));
                  auVar23[0xe] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0xe] ==
                                  *(uchar *)((long)plVar4 + 0xe));
                  auVar23[0xf] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                   _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                   _M_value.super_base_blob<256U>.m_data._M_elems[0xf] ==
                                  *(uchar *)((long)plVar4 + 0xf));
                  auVar23 = auVar23 & auVar25;
                  if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff) {
                    local_f8._1_7_ = (undefined7)((ulong)local_f8._0_8_ >> 8);
                    local_f8[0] = *(uint64_t *)(local_198._0_8_ + 0x50) != 0;
                    pcVar19 = "pindex->m_chain_tx_count > 0";
                    inline_assertion_check<true,bool>
                              ((bool *)local_f8,
                               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                               ,0x1c5,"LoadBlockIndex","pindex->m_chain_tx_count > 0");
                    goto LAB_0091a4de;
                  }
                }
                if (pCVar13->m_chain_tx_count == 0) {
                  *(uint64_t *)(local_198._0_8_ + 0x50) = 0;
                  local_f8._8_8_ = local_198._0_8_;
                  local_f8._0_8_ = pCVar13;
                  std::
                  _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                  ::_M_emplace_equal<std::pair<CBlockIndex*,CBlockIndex*>>
                            ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                              *)&this->m_blocks_unlinked,
                             (pair<CBlockIndex_*,_CBlockIndex_*> *)local_f8);
                }
                else {
                  *(uint64_t *)(local_198._0_8_ + 0x50) =
                       pCVar13->m_chain_tx_count + (ulong)*(uint *)(local_198._0_8_ + 0x48);
                }
              }
            }
LAB_0091a4de:
            if ((((*(uint32_t *)(local_198._0_8_ + 0x58) & 0x60) == 0) &&
                (*(CBlockIndex **)(local_198._0_8_ + 8) != (CBlockIndex *)0x0)) &&
               (((*(CBlockIndex **)(local_198._0_8_ + 8))->nStatus & 0x60) != 0)) {
              *(uint32_t *)(local_198._0_8_ + 0x58) = *(uint32_t *)(local_198._0_8_ + 0x58) | 0x40;
              std::
              _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
              ::_M_insert_unique<CBlockIndex*const&>
                        ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                          *)&this->m_dirty_blockindex,(CBlockIndex **)local_198);
            }
            if (*(CBlockIndex **)(local_198._0_8_ + 8) != (CBlockIndex *)0x0) {
              CBlockIndex::BuildSkip((CBlockIndex *)local_198._0_8_);
            }
            ppCVar20 = ppCVar20 + 1;
            pCVar13 = (CBlockIndex *)uVar7;
          } while (ppCVar20 !=
                   local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
          bVar9 = true;
        }
      }
LAB_0091a661:
      if (local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98[0].
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98[0].
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98[0].
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0091a679;
    }
    pCVar1 = (this->m_opts).chainparams;
    pAVar18 = (pCVar1->m_assumeutxo_data).
              super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar2 = (pCVar1->m_assumeutxo_data).
             super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pAVar18 != pAVar2) {
      do {
        auVar22[0] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0]);
        auVar22[1] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[1] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[1]);
        auVar22[2] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[2] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[2]);
        auVar22[3] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[3] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[3]);
        auVar22[4] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[4] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[4]);
        auVar22[5] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[5] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[5]);
        auVar22[6] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[6] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[6]);
        auVar22[7] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[7] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[7]);
        auVar22[8] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[8] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[8]);
        auVar22[9] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[9] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[9]);
        auVar22[10] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[10] ==
                       (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[10]);
        auVar22[0xb] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0xb] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar22[0xc] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0xc] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar22[0xd] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0xd] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar22[0xe] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0xe] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar22[0xf] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0xf] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar24[0] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x10] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar24[1] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x11] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar24[2] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x12] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar24[3] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x13] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar24[4] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x14] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar24[5] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x15] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar24[6] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x16] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar24[7] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x17] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar24[8] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x18] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar24[9] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x19] ==
                      (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                      super__Optional_payload_base<uint256>._M_payload._M_value.
                      super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar24[10] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                       super__Optional_payload_base<uint256>._M_payload._M_value.
                       super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar24[0xb] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar24[0xc] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar24[0xd] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar24[0xe] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar24[0xf] = -((pAVar18->blockhash).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                        super__Optional_payload_base<uint256>._M_payload._M_value.
                        super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar24 = auVar24 & auVar22;
        uVar5 = (ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf;
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar5;
        if (uVar5 == 0xffff) {
          poVar12 = (optional<AssumeutxoData> *)local_f8;
          for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
            *(undefined8 *)
             &(poVar12->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
              super__Optional_payload_base<AssumeutxoData>._M_payload = *(undefined8 *)pAVar18;
            pAVar18 = (pointer)((long)pAVar18 + ((ulong)bVar21 * -2 + 1) * 8);
            poVar12 = (optional<AssumeutxoData> *)((long)poVar12 + (ulong)bVar21 * -0x10 + 8);
          }
          auStack_e8[0x40] = true;
          pcVar19 = "maybe_au_data";
          poVar12 = inline_assertion_check<true,std::optional<AssumeutxoData>const&>
                              ((optional<AssumeutxoData> *)local_f8,
                               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                               ,0x19a,"LoadBlockIndex","maybe_au_data");
          (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int> =
               (_Optional_payload_base<int>)
               ((ulong)(uint)(poVar12->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
                             super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.height
               | 0x100000000);
          pCVar13 = LookupBlockIndex(this,(uint256 *)snapshot_blockhash);
          pCVar13->m_chain_tx_count =
               (poVar12->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
               super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.m_chain_tx_count;
          base_blob<256u>::ToString_abi_cxx11_((string *)local_198,snapshot_blockhash);
          pLVar14 = LogInstance();
          bVar9 = BCLog::Logger::Enabled(pLVar14);
          if (bVar9) {
            local_138._8_8_ = (CBlockIndex *)0x0;
            local_138._16_8_ = local_138._16_8_ & 0xffffffffffffff00;
            local_138._0_8_ = (CBlockIndex *)(local_138 + 0x10);
            tinyformat::format<unsigned_long,std::__cxx11::string>
                      (&local_178,(tinyformat *)"[snapshot] set m_chain_tx_count=%d for %s\n",
                       (char *)&(poVar12->super__Optional_base<AssumeutxoData,_true,_true>).
                                _M_payload.super__Optional_payload_base<AssumeutxoData>._M_payload.
                                _M_value.m_chain_tx_count,(unsigned_long *)local_198,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar19)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138
                      ,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            pLVar14 = LogInstance();
            local_178._M_dataplus._M_p = (pointer)0x5e;
            local_178._M_string_length = 0xfa6684;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
            ;
            source_file._M_len = 0x5e;
            str._M_str = (char *)local_138._0_8_;
            str._M_len = local_138._8_8_;
            logging_function._M_str = "LoadBlockIndex";
            logging_function._M_len = 0xe;
            BCLog::Logger::LogPrintStr(pLVar14,str,logging_function,source_file,0x1a2,ALL,Info);
            if ((CBlockIndex *)local_138._0_8_ != (CBlockIndex *)(local_138 + 0x10)) {
              operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
            }
          }
          if ((CBlockIndex *)local_198._0_8_ != (CBlockIndex *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
          }
          cVar16 = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_engaged;
          cVar10 = (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                   super__Optional_payload_base<uint256>._M_engaged;
          goto LAB_0091a1df;
        }
        pAVar18 = pAVar18 + 1;
      } while (pAVar18 != pAVar2);
    }
    auStack_e8[0x40] = false;
    pNVar3 = (this->m_opts).notifications;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"Assumeutxo data not found for the given blockhash \'%s\'.","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"Assumeutxo data not found for the given blockhash \'%s\'.",""
                );
    }
    else {
      local_58._M_dataplus._M_p = "Assumeutxo data not found for the given blockhash \'%s\'.";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_158,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_58);
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_58,snapshot_blockhash);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)local_138,(tinyformat *)&local_178,(bilingual_str *)&local_58,args);
    (*pNVar3->_vptr_Notifications[8])(pNVar3,local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_p != &local_108) {
      operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
    }
    if ((CBlockIndex *)local_138._0_8_ != (CBlockIndex *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if (local_58._M_dataplus._M_p != (pointer)((long)&local_58 + 0x10)) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
  }
  bVar9 = false;
LAB_0091a679:
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_38._M_p) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool BlockManager::LoadBlockIndex(const std::optional<uint256>& snapshot_blockhash)
{
    if (!m_block_tree_db->LoadBlockIndexGuts(
            GetConsensus(), [this](const uint256& hash) EXCLUSIVE_LOCKS_REQUIRED(cs_main) { return this->InsertBlockIndex(hash); }, m_interrupt)) {
        return false;
    }

    if (snapshot_blockhash) {
        const std::optional<AssumeutxoData> maybe_au_data = GetParams().AssumeutxoForBlockhash(*snapshot_blockhash);
        if (!maybe_au_data) {
            m_opts.notifications.fatalError(strprintf(_("Assumeutxo data not found for the given blockhash '%s'."), snapshot_blockhash->ToString()));
            return false;
        }
        const AssumeutxoData& au_data = *Assert(maybe_au_data);
        m_snapshot_height = au_data.height;
        CBlockIndex* base{LookupBlockIndex(*snapshot_blockhash)};

        // Since m_chain_tx_count (responsible for estimated progress) isn't persisted
        // to disk, we must bootstrap the value for assumedvalid chainstates
        // from the hardcoded assumeutxo chainparams.
        base->m_chain_tx_count = au_data.m_chain_tx_count;
        LogPrintf("[snapshot] set m_chain_tx_count=%d for %s\n", au_data.m_chain_tx_count, snapshot_blockhash->ToString());
    } else {
        // If this isn't called with a snapshot blockhash, make sure the cached snapshot height
        // is null. This is relevant during snapshot completion, when the blockman may be loaded
        // with a height that then needs to be cleared after the snapshot is fully validated.
        m_snapshot_height.reset();
    }

    Assert(m_snapshot_height.has_value() == snapshot_blockhash.has_value());

    // Calculate nChainWork
    std::vector<CBlockIndex*> vSortedByHeight{GetAllBlockIndices()};
    std::sort(vSortedByHeight.begin(), vSortedByHeight.end(),
              CBlockIndexHeightOnlyComparator());

    CBlockIndex* previous_index{nullptr};
    for (CBlockIndex* pindex : vSortedByHeight) {
        if (m_interrupt) return false;
        if (previous_index && pindex->nHeight > previous_index->nHeight + 1) {
            LogError("%s: block index is non-contiguous, index of height %d missing\n", __func__, previous_index->nHeight + 1);
            return false;
        }
        previous_index = pindex;
        pindex->nChainWork = (pindex->pprev ? pindex->pprev->nChainWork : 0) + GetBlockProof(*pindex);
        pindex->nTimeMax = (pindex->pprev ? std::max(pindex->pprev->nTimeMax, pindex->nTime) : pindex->nTime);

        // We can link the chain of blocks for which we've received transactions at some point, or
        // blocks that are assumed-valid on the basis of snapshot load (see
        // PopulateAndValidateSnapshot()).
        // Pruned nodes may have deleted the block.
        if (pindex->nTx > 0) {
            if (pindex->pprev) {
                if (m_snapshot_height && pindex->nHeight == *m_snapshot_height &&
                        pindex->GetBlockHash() == *snapshot_blockhash) {
                    // Should have been set above; don't disturb it with code below.
                    Assert(pindex->m_chain_tx_count > 0);
                } else if (pindex->pprev->m_chain_tx_count > 0) {
                    pindex->m_chain_tx_count = pindex->pprev->m_chain_tx_count + pindex->nTx;
                } else {
                    pindex->m_chain_tx_count = 0;
                    m_blocks_unlinked.insert(std::make_pair(pindex->pprev, pindex));
                }
            } else {
                pindex->m_chain_tx_count = pindex->nTx;
            }
        }
        if (!(pindex->nStatus & BLOCK_FAILED_MASK) && pindex->pprev && (pindex->pprev->nStatus & BLOCK_FAILED_MASK)) {
            pindex->nStatus |= BLOCK_FAILED_CHILD;
            m_dirty_blockindex.insert(pindex);
        }
        if (pindex->pprev) {
            pindex->BuildSkip();
        }
    }

    return true;
}